

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

iterator __thiscall
QVLABase<QDialogButtonBox::ButtonRole>::emplace_impl<QDialogButtonBox::ButtonRole_const&>
          (QVLABase<QDialogButtonBox::ButtonRole> *this,qsizetype prealloc,void *array,
          const_iterator before,ButtonRole *args)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  iterator pBVar4;
  
  pvVar1 = (this->super_QVLABaseBase).ptr;
  emplace_back_impl<QDialogButtonBox::ButtonRole_const&>(this,prealloc,array,args);
  lVar2 = (this->super_QVLABaseBase).s;
  pvVar3 = (this->super_QVLABaseBase).ptr;
  pBVar4 = (iterator)(((long)before - (long)pvVar1) + (long)pvVar3);
  std::_V2::__rotate<unsigned_char*>
            (pBVar4,(long)pvVar3 + lVar2 * 4 + -4,(void *)((long)pvVar3 + lVar2 * 4));
  return pBVar4;
}

Assistant:

Q_OUTOFLINE_TEMPLATE auto QVLABase<T>::emplace_impl(qsizetype prealloc, void *array, const_iterator before, Args &&...args) -> iterator
{
    Q_ASSERT_X(isValidIterator(before), "QVarLengthArray::insert", "The specified const_iterator argument 'before' is invalid");
    Q_ASSERT(size() <= capacity());
    Q_ASSERT(capacity() > 0);

    const qsizetype offset = qsizetype(before - cbegin());
    emplace_back_impl(prealloc, array, std::forward<Args>(args)...);
    const auto b = begin() + offset;
    const auto e = end();
    QtPrivate::q_rotate(b, e - 1, e);
    return b;
}